

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings.cpp
# Opt level: O0

void __thiscall
CBlockHeaderAndShortTxIDs::CBlockHeaderAndShortTxIDs
          (CBlockHeaderAndShortTxIDs *this,CBlock *block,uint64_t nonce)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  size_type __n;
  Wtxid *pWVar8;
  reference pvVar9;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  CTransaction *tx;
  size_t i;
  CTransaction *in_stack_ffffffffffffff48;
  PrefilledTransaction *in_stack_ffffffffffffff50;
  PrefilledTransaction *in_stack_ffffffffffffff58;
  uchar *wtxid;
  allocator_type *in_stack_ffffffffffffff68;
  CBlockHeaderAndShortTxIDs *this_00;
  size_type in_stack_ffffffffffffff70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff78;
  vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *this_01;
  uchar *local_58;
  CBlockHeaderAndShortTxIDs *in_stack_ffffffffffffffb0;
  undefined1 auStack_20 [24];
  pointer local_8;
  
  local_8 = *(pointer *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)(in_RDI + 0x10) = in_RDX;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *)in_stack_ffffffffffffff48);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)in_stack_ffffffffffffff48);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             (allocator_type *)in_stack_ffffffffffffff68);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)in_stack_ffffffffffffff48);
  __n = in_RDI + 0x30;
  this_01 = (vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *)
            (auStack_20 + 0x16);
  std::allocator<PrefilledTransaction>::allocator
            ((allocator<PrefilledTransaction> *)in_stack_ffffffffffffff48);
  std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::vector
            (this_01,__n,in_stack_ffffffffffffff68);
  std::allocator<PrefilledTransaction>::~allocator
            ((allocator<PrefilledTransaction> *)in_stack_ffffffffffffff48);
  uVar1 = in_RSI[9];
  *(undefined8 *)(in_RDI + 0x88) = in_RSI[8];
  *(undefined8 *)(in_RDI + 0x90) = uVar1;
  uVar1 = *in_RSI;
  uVar2 = in_RSI[1];
  uVar3 = in_RSI[2];
  uVar4 = in_RSI[3];
  uVar5 = in_RSI[4];
  uVar6 = in_RSI[5];
  uVar7 = in_RSI[7];
  *(undefined8 *)(in_RDI + 0x78) = in_RSI[6];
  *(undefined8 *)(in_RDI + 0x80) = uVar7;
  *(undefined8 *)(in_RDI + 0x68) = uVar5;
  *(undefined8 *)(in_RDI + 0x70) = uVar6;
  *(undefined8 *)(in_RDI + 0x58) = uVar3;
  *(undefined8 *)(in_RDI + 0x60) = uVar4;
  *(undefined8 *)(in_RDI + 0x48) = uVar1;
  *(undefined8 *)(in_RDI + 0x50) = uVar2;
  FillShortTxIDSelector(in_stack_ffffffffffffffb0);
  this_00 = (CBlockHeaderAndShortTxIDs *)auStack_20;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffff58,(size_type)in_stack_ffffffffffffff50);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffff48,
             (shared_ptr<const_CTransaction> *)0x8b7b5c);
  std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::operator[]
            ((vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *)
             in_stack_ffffffffffffff58,(size_type)in_stack_ffffffffffffff50);
  PrefilledTransaction::operator=(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  PrefilledTransaction::~PrefilledTransaction((PrefilledTransaction *)in_stack_ffffffffffffff48);
  local_58 = (uchar *)0x1;
  while( true ) {
    wtxid = local_58;
    pWVar8 = (Wtxid *)std::
                      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                              *)in_stack_ffffffffffffff48);
    if (pWVar8 <= wtxid) break;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_ffffffffffffff58,(size_type)in_stack_ffffffffffffff50);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff58 =
         (PrefilledTransaction *)CTransaction::GetWitnessHash(in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff50 = (PrefilledTransaction *)GetShortID(this_00,(Wtxid *)wtxid);
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_ffffffffffffff58,(size_type)in_stack_ffffffffffffff50);
    *pvVar9 = (value_type)in_stack_ffffffffffffff50;
    local_58 = local_58 + 1;
  }
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CBlockHeaderAndShortTxIDs::CBlockHeaderAndShortTxIDs(const CBlock& block, const uint64_t nonce) :
        nonce(nonce),
        shorttxids(block.vtx.size() - 1), prefilledtxn(1), header(block) {
    FillShortTxIDSelector();
    //TODO: Use our mempool prior to block acceptance to predictively fill more than just the coinbase
    prefilledtxn[0] = {0, block.vtx[0]};
    for (size_t i = 1; i < block.vtx.size(); i++) {
        const CTransaction& tx = *block.vtx[i];
        shorttxids[i - 1] = GetShortID(tx.GetWitnessHash());
    }
}